

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long __thiscall mkvparser::Tracks::Parse(Tracks *this)

{
  IMkvReader *pReader;
  longlong element_start;
  long lVar1;
  Track **ppTVar2;
  long lVar3;
  Tracks *this_00;
  uint uVar4;
  long stop;
  long lStack_60;
  longlong pos;
  longlong size;
  longlong id;
  Tracks *local_38;
  
  if (this->m_trackEntries != (Track **)0x0) {
    __assert_fail("m_trackEntries == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1619,"long mkvparser::Tracks::Parse()");
  }
  if (this->m_trackEntriesEnd != (Track **)0x0) {
    __assert_fail("m_trackEntriesEnd == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x161a,"long mkvparser::Tracks::Parse()");
  }
  pos = this->m_start;
  stop = this->m_size + pos;
  pReader = this->m_pSegment->m_pReader;
  uVar4 = 0;
  local_38 = this;
  while (pos < stop) {
    lVar1 = ParseElementHeader(pReader,&pos,stop,&id,&size);
    if (lVar1 < 0) {
      return lVar1;
    }
    if (size != 0) {
      pos = pos + size;
      if (stop < pos) goto LAB_0010b95c;
      uVar4 = uVar4 + (id == 0xae);
    }
  }
  if (pos == stop) {
    if ((int)uVar4 < 1) {
      lStack_60 = 0;
    }
    else {
      ppTVar2 = (Track **)operator_new__((ulong)uVar4 << 3,(nothrow_t *)&std::nothrow);
      local_38->m_trackEntries = ppTVar2;
      if (ppTVar2 == (Track **)0x0) {
        lStack_60 = -1;
      }
      else {
        local_38->m_trackEntriesEnd = ppTVar2;
        this_00 = local_38;
        lVar1 = local_38->m_start;
        while (pos = lVar1, element_start = pos, pos < stop) {
          lVar1 = ParseElementHeader(pReader,&pos,stop,&id,&size);
          if (lVar1 < 0) {
            return lVar1;
          }
          lVar1 = pos;
          if (size != 0) {
            lVar1 = pos + size;
            if (stop < lVar1) {
              __assert_fail("payload_stop <= stop",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                            ,0x1653,"long mkvparser::Tracks::Parse()");
            }
            if (id == 0xae) {
              ppTVar2 = this_00->m_trackEntriesEnd;
              *ppTVar2 = (Track *)0x0;
              lVar3 = ParseTrackEntry(this_00,pos,size,element_start,lVar1 - element_start,ppTVar2);
              if (lVar3 != 0) {
                return lVar3;
              }
              this_00 = local_38;
              if (*ppTVar2 != (Track *)0x0) {
                local_38->m_trackEntriesEnd = local_38->m_trackEntriesEnd + 1;
              }
            }
          }
        }
        lStack_60 = (ulong)(pos == stop) * 2 + -2;
      }
    }
  }
  else {
LAB_0010b95c:
    lStack_60 = -2;
  }
  return lStack_60;
}

Assistant:

long Tracks::Parse() {
  assert(m_trackEntries == NULL);
  assert(m_trackEntriesEnd == NULL);

  const long long stop = m_start + m_size;
  IMkvReader* const pReader = m_pSegment->m_pReader;

  int count = 0;
  long long pos = m_start;

  while (pos < stop) {
    long long id, size;

    const long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (size == 0)  // weird
      continue;

    if (id == libwebm::kMkvTrackEntry)
      ++count;

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  if (count <= 0)
    return 0;  // success

  m_trackEntries = new (std::nothrow) Track*[count];

  if (m_trackEntries == NULL)
    return -1;

  m_trackEntriesEnd = m_trackEntries;

  pos = m_start;

  while (pos < stop) {
    const long long element_start = pos;

    long long id, payload_size;

    const long status =
        ParseElementHeader(pReader, pos, stop, id, payload_size);

    if (status < 0)  // error
      return status;

    if (payload_size == 0)  // weird
      continue;

    const long long payload_stop = pos + payload_size;
    assert(payload_stop <= stop);  // checked in ParseElement

    const long long element_size = payload_stop - element_start;

    if (id == libwebm::kMkvTrackEntry) {
      Track*& pTrack = *m_trackEntriesEnd;
      pTrack = NULL;

      const long status = ParseTrackEntry(pos, payload_size, element_start,
                                          element_size, pTrack);
      if (status)
        return status;

      if (pTrack)
        ++m_trackEntriesEnd;
    }

    pos = payload_stop;
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  return 0;  // success
}